

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O0

void __thiscall
aom::AV1RateControlRTC::PostEncodeUpdate(AV1RateControlRTC *this,uint64_t encoded_frame_size)

{
  long *in_RDI;
  uint64_t in_stack_00000048;
  AV1_COMP *in_stack_00000050;
  
  *(int *)(*in_RDI + 0x3bf90) = *(int *)(*in_RDI + 0x3bf90) + 1;
  av1_rc_postencode_update(in_stack_00000050,in_stack_00000048);
  if (*(int *)(*in_RDI + 0x9d330) == *(int *)(*in_RDI + 0x9d338) + -1) {
    *(undefined4 *)(*in_RDI + 0x9d340) = *(undefined4 *)(*in_RDI + 0x9d338);
    *(int *)(*in_RDI + 0x607a0) = *(int *)(*in_RDI + 0x607a0) + 1;
  }
  if ((1 < *(int *)(*in_RDI + 0x9d338)) || (1 < *(int *)(*in_RDI + 0x9d33c))) {
    av1_save_layer_context((AV1_COMP *)this);
  }
  return;
}

Assistant:

void AV1RateControlRTC::PostEncodeUpdate(uint64_t encoded_frame_size) {
  cpi_->common.current_frame.frame_number++;
  av1_rc_postencode_update(cpi_, encoded_frame_size);
  if (cpi_->svc.spatial_layer_id == cpi_->svc.number_spatial_layers - 1) {
    cpi_->svc.prev_number_spatial_layers = cpi_->svc.number_spatial_layers;
    cpi_->rc.frames_since_key++;
  }
  if (cpi_->svc.number_spatial_layers > 1 ||
      cpi_->svc.number_temporal_layers > 1)
    av1_save_layer_context(cpi_);
}